

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O1

void __thiscall
onmt::TokensBuilder::append
          (TokensBuilder *this,
          vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> *chars,
          size_t begin,size_t end)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = end - begin;
  if (begin <= end && lVar1 != 0) {
    uVar2 = begin << 5 | 8;
    do {
      std::__cxx11::string::append
                ((char *)&this->_current_token,
                 *(ulong *)((long)(chars->
                                  super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (uVar2 - 8)));
      this->_current_length = this->_current_length + 1;
      uVar2 = uVar2 + 0x20;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void append(const std::vector<unicode::CharInfo>& chars,
                const size_t begin,
                const size_t end)
    {
      for (size_t i = begin; i < end; ++i)
        append(chars[i]);
    }